

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall
despot::util::tinyxml::TiXmlDocument::LoadFile
          (TiXmlDocument *this,FILE *file,TiXmlEncoding encoding)

{
  char cVar1;
  int err;
  char *pcVar2;
  size_type cap;
  char *__ptr;
  size_t sVar3;
  char *str;
  size_type len;
  byte bVar4;
  TiXmlString data;
  
  if (file == (FILE *)0x0) {
    err = 2;
  }
  else {
    TiXmlNode::Clear(&this->super_TiXmlNode);
    (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
    (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
    fseek((FILE *)file,0,2);
    cap = ftell((FILE *)file);
    fseek((FILE *)file,0,0);
    if (0 < (long)cap) {
      data.rep_ = (Rep *)TiXmlString::nullrep_;
      TiXmlString::reserve(&data,cap);
      __ptr = (char *)operator_new__(cap + 1);
      *__ptr = '\0';
      sVar3 = fread(__ptr,cap,1,(FILE *)file);
      if (sVar3 != 1) {
        operator_delete__(__ptr);
        bVar4 = 0;
        SetError(this,2,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
LAB_001782ce:
        TiXmlString::quit(&data);
        return (bool)bVar4;
      }
      __ptr[cap] = '\0';
      pcVar2 = __ptr;
LAB_001781b5:
      do {
        str = pcVar2;
        len = 0;
        while( true ) {
          cVar1 = str[len];
          if (cVar1 == '\0') {
            if (len != 0) {
              TiXmlString::append(&data,str,len);
            }
            operator_delete__(__ptr);
            (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])
                      (this,(data.rep_)->str,0,(ulong)encoding);
            bVar4 = this->error ^ 1;
            goto LAB_001782ce;
          }
          if (__ptr + cap <= str + len) {
            __assert_fail("p < (buf + length)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                          ,0x36c,
                          "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                         );
          }
          if (cVar1 == '\r') {
            if (0 < (long)len) {
              TiXmlString::append(&data,str,len);
            }
            TiXmlString::operator+=(&data,'\n');
            pcVar2 = str + len + 1;
            if ((str[len + 1] == '\n') && (pcVar2 = str + len + 2, __ptr + cap < str + len + 2)) {
              __assert_fail("p <= (buf + length)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                            ,0x380,
                            "bool despot::util::tinyxml::TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)"
                           );
            }
            goto LAB_001781b5;
          }
          if (cVar1 == '\n') break;
          len = len + 1;
        }
        TiXmlString::append(&data,str,len + 1);
        pcVar2 = str + len + 1;
      } while( true );
    }
    err = 0xd;
  }
  SetError(this,err,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
  return false;
}

Assistant:

bool TiXmlDocument::LoadFile(FILE* file, TiXmlEncoding encoding) {
	if (!file) {
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	// Delete the existing data:
	Clear();
	location.Clear();

	// Get the file size, so we can pre-allocate the string. HUGE speed impact.
	long length = 0;
	fseek(file, 0, SEEK_END);
	length = ftell(file);
	fseek(file, 0, SEEK_SET);

	// Strange case, but good to handle up front.
	if (length <= 0) {
		SetError(TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}
	// If we have a file, assume it is all one big XML file, and read it in.
	// The document parser may decide the document ends sooner than the entire file, however.
	TIXML_STRING data;
	data.reserve(length);

	// Subtle bug here. TinyXml did use fgets. But from the XML spec:
	// 2.11 End-of-Line Handling
	// <snip>
	// <quote>
	// ...the XML processor MUST behave as if it normalized all line breaks in external
	// parsed entities (including the document entity) on input, before parsing, by translating
	// both the two-character sequence #xD #xA and any #xD that is not followed by #xA to
	// a single #xA character.
	// </quote>
	//
	// It is not clear fgets does that, and certainly isn't clear it works cross platform.
	// Generally, you expect fgets to translate from the convention of the OS to the c/unix
	// convention, and not work generally.

	/*
	 while( fgets( buf, sizeof(buf), file ) )
	 {
	 data += buf;
	 }
	 */

	char* buf = new char[length + 1];
	buf[0] = 0;

	if (fread(buf, length, 1, file) != 1) {
		delete[] buf;
		SetError(TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN);
		return false;
	}

	const char* lastPos = buf;
	const char* p = buf;

	buf[length] = 0;
	while (*p) {
		assert(p < (buf + length));
		if (*p == 0xa) {
			// Newline character. No special rules for this. Append all the characters
			// since the last string, and include the newline.
			data.append(lastPos, (p - lastPos + 1)); // append, include the newline
			++p; // move past the newline
			lastPos = p; // and point to the new buffer (may be 0)
			assert(p <= (buf + length));
		} else if (*p == 0xd) {
			// Carriage return. Append what we have so far, then
			// handle moving forward in the buffer.
			if ((p - lastPos) > 0) {
				data.append(lastPos, p - lastPos); // do not add the CR
			}
			data += (char) 0xa; // a proper newline

			if (*(p + 1) == 0xa) {
				// Carriage return - new line sequence
				p += 2;
				lastPos = p;
				assert(p <= (buf + length));
			} else {
				// it was followed by something else...that is presumably characters again.
				++p;
				lastPos = p;
				assert(p <= (buf + length));
			}
		} else {
			++p;
		}
	}
	// Handle any left over characters.
	if (p - lastPos) {
		data.append(lastPos, p - lastPos);
	}
	delete[] buf;
	buf = 0;

	Parse(data.c_str(), 0, encoding);

	if (Error())
		return false;
	else
		return true;
}